

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val
          (value_type *__return_storage_ptr__,
          FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  Fad<Fad<double>_> *pFVar5;
  Fad<Fad<double>_> *pFVar6;
  uint uVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  
  pFVar5 = this->left_;
  pFVar6 = this->right_;
  dVar1 = (pFVar5->val_).val_;
  dVar2 = (pFVar6->val_).val_;
  __return_storage_ptr__->val_ = dVar1 / dVar2;
  uVar3 = (pFVar5->val_).dx_.num_elts;
  uVar4 = (pFVar6->val_).dx_.num_elts;
  uVar7 = uVar4;
  if ((int)uVar4 < (int)uVar3) {
    uVar7 = uVar3;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((int)uVar7 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar7;
    pdVar8 = (double *)operator_new__((ulong)uVar7 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar8;
    __return_storage_ptr__->defaultVal = 0.0;
    pdVar9 = (pFVar5->val_).dx_.ptr_to_data;
    pdVar10 = (pFVar6->val_).dx_.ptr_to_data;
    uVar11 = 0;
    do {
      pdVar12 = pdVar9;
      if (uVar3 == 0) {
        pdVar12 = &(pFVar5->val_).defaultVal;
      }
      pdVar13 = pdVar10;
      if (uVar4 == 0) {
        pdVar13 = &(pFVar6->val_).defaultVal;
      }
      pdVar8[uVar11] = (*pdVar12 * dVar2 - *pdVar13 * dVar1) / (dVar2 * dVar2);
      uVar11 = uVar11 + 1;
      pdVar10 = pdVar10 + 1;
      pdVar9 = pdVar9 + 1;
    } while (uVar7 != uVar11);
  }
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}